

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_fcadd_h_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  ushort uVar1;
  ulong uVar2;
  float16 a;
  float16 fVar3;
  float16 fVar4;
  float16 fVar5;
  int32_t sign;
  long lVar6;
  float16 e3;
  float16 e2;
  float16 e1;
  float16 e0;
  uint64_t pg;
  float16 neg_real;
  float16 neg_imag;
  uint64_t *g;
  intptr_t i;
  intptr_t j;
  uint32_t desc_local;
  void *vs_local;
  void *vg_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  g = (uint64_t *)simd_oprsz(desc);
  sign = simd_data(desc);
  a = float16_set_sign(0,sign);
  fVar3 = float16_chs(a);
  do {
    uVar2 = *(ulong *)((long)vg + ((long)g + -1 >> 6) * 8);
    do {
      lVar6 = (long)g + -2;
      g = (uint64_t *)((long)g - 4);
      fVar5 = *(float16 *)((long)vn + lVar6);
      uVar1 = *(ushort *)((long)vm + (long)g);
      if ((uVar2 >> ((byte)g & 0x3f) & 1) != 0) {
        fVar4 = float16_add_aarch64(*(float16 *)((long)vn + (long)g),
                                    *(ushort *)((long)vm + lVar6) ^ fVar3,(float_status *)vs);
        *(float16 *)((long)vd + (long)g) = fVar4;
      }
      if ((uVar2 >> ((byte)lVar6 & 0x3f) & 1) != 0) {
        fVar5 = float16_add_aarch64(fVar5,uVar1 ^ a,(float_status *)vs);
        *(float16 *)((long)vd + lVar6) = fVar5;
      }
    } while (((ulong)g & 0x3f) != 0);
  } while (g != (uint64_t *)0x0);
  return;
}

Assistant:

void HELPER(sve_fcadd_h)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float16 neg_imag = float16_set_sign(0, simd_data(desc));
    float16 neg_real = float16_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float16 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float16);
            i -= 2 * sizeof(float16);

            e0 = *(float16 *)((char *)vn + H1_2(i));
            e1 = *(float16 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float16 *)((char *)vn + H1_2(j));
            e3 = *(float16 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float16 *)((char *)vd + H1_2(i)) = float16_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float16 *)((char *)vd + H1_2(j)) = float16_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}